

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *pcVar4;
  cmLocalNinjaGenerator *pcVar5;
  cmGeneratorTarget *this_00;
  pointer pcVar6;
  TargetType targetType;
  string *psVar7;
  cmGlobalNinjaGenerator *pcVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string compileCmd;
  string flags;
  string linker;
  cmNinjaRule rule;
  RuleVariables vars;
  allocator_type local_3e9;
  string local_3e8;
  char *local_3c8;
  undefined8 local_3c0;
  cmRulePlaceholderExpander *local_3b8;
  undefined1 local_3b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  undefined1 local_310 [32];
  cmMakefile *local_2f0;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  char *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  char *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  bool local_190;
  undefined1 local_188 [32];
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  pointer local_c8;
  char *local_c0;
  char *local_48;
  char *local_40;
  
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  LanguageLinkerCudaDeviceRule(&local_2e8,this,config);
  local_2b0._0_8_ = local_2b0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p == &local_2e8.field_2) {
    local_2b0._24_4_ = local_2e8.field_2._8_4_;
    local_2b0._28_4_ = local_2e8.field_2._12_4_;
  }
  else {
    local_2b0._0_8_ = local_2e8._M_dataplus._M_p;
  }
  local_290._M_p = (pointer)&local_280;
  local_2b0._8_8_ = local_2e8._M_string_length;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity._0_4_ =
       local_2e8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_288 = 0;
  local_280._M_local_buf[0] = '\0';
  local_270._M_p = (pointer)&local_260;
  local_268 = (char *)0x0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_p = (pointer)&local_240;
  local_248 = (char *)0x0;
  local_240._M_local_buf[0] = '\0';
  local_230._M_p = (pointer)&local_220;
  local_228 = 0;
  local_220._M_local_buf[0] = '\0';
  local_210._M_p = (pointer)&local_200;
  local_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_1f0._M_p = (pointer)&local_1e0;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_p = (pointer)&local_1c0;
  local_1c8 = 0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190 = false;
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_390._M_allocated_capacity = (size_type)&local_380;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_390,"CMAKE_CUDA_DEVICE_LINKER","");
  psVar7 = cmMakefile::GetRequiredDefinition(pcVar4,(string *)&local_390);
  local_188._8_8_ = (psVar7->_M_dataplus)._M_p;
  local_188._0_8_ = psVar7->_M_string_length;
  local_188._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_188._24_8_ = 0x22;
  local_168 = " -arch=$ARCH $REGISTER -o=$out $in";
  local_160 = (char *)0x0;
  views._M_len = 2;
  views._M_array = (iterator)local_188;
  cmCatViews(&local_350,views);
  __l._M_len = 1;
  __l._M_array = &local_350;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3b0,__l,(allocator_type *)&local_370);
  local_188._8_8_ = (char *)0x0;
  local_188._16_8_ = local_188._16_8_ & 0xffffffffffffff00;
  local_2f0 = pcVar4;
  local_188._0_8_ = local_188 + 0x10;
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_3e8,pcVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3b0,config,config,(string *)local_188,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_290,(string *)&local_3e8);
  paVar1 = &local_3e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_allocated_capacity != &local_380) {
    operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,local_248,0x965702);
  std::__cxx11::string::_M_replace((ulong)&local_270,0,local_268,0x965720);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_2b0);
  memset(local_188,0,0x158);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  local_188._0_8_ = (psVar7->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar7 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  local_188._8_8_ = (psVar7->_M_dataplus)._M_p;
  local_158 = "CUDA";
  local_108 = "$out";
  local_48 = "$FATBIN";
  local_40 = "$REGISTER";
  local_c0 = "$LINK_FLAGS";
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"CUDA","");
  cmGeneratorTarget::GetLinkerTool(&local_350,this_00,&local_3e8,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_c8 = local_350._M_dataplus._M_p;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"CUDA","");
  pbVar2 = (pointer)(local_3b0 + 0x10);
  local_3b0._8_8_ = (pointer)0x0;
  local_3b0[0x10] = '\0';
  local_3b0._0_8_ = pbVar2;
  cmCommonTargetGenerator::GetFlags
            ((string *)&local_390,(cmCommonTargetGenerator *)this,&local_3e8,config,
             (string *)local_3b0);
  if ((pointer)local_3b0._0_8_ != pbVar2) {
    operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_390._M_allocated_capacity;
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"CMAKE_CUDA_DEVICE_LINK_COMPILE","");
  psVar7 = cmMakefile::GetRequiredDefinition(pcVar4,&local_3e8);
  pcVar6 = (psVar7->_M_dataplus)._M_p;
  local_3b0._0_8_ = pbVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,pcVar6,pcVar6 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_3b8);
  cmRulePlaceholderExpander::ExpandRuleVariables
            (local_3b8,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
             (string *)local_3b0,(RuleVariables *)local_188);
  LanguageLinkerCudaDeviceCompileRule(&local_3e8,this,config);
  std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_370,local_3b0._0_8_,
             (pointer)((long)&((_Alloc_hider *)local_3b0._8_8_)->_M_p + local_3b0._0_8_));
  __l_00._M_len = 1;
  __l_00._M_array = &local_370;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_310,__l_00,(allocator_type *)&local_2c8);
  paVar3 = &local_330.field_2;
  local_330._M_string_length = 0;
  local_330.field_2._M_local_buf[0] = '\0';
  local_330._M_dataplus._M_p = (pointer)paVar3;
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_3e8,pcVar5,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_310,config,config,&local_330,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_290,(string *)&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar3) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,local_248,0x965763);
  std::__cxx11::string::_M_replace((ulong)&local_270,0,local_268,0x965789);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_2b0);
  LanguageLinkerCudaFatbinaryRule(&local_3e8,this,config);
  std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_310._0_8_ = (pointer)(local_310 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"CMAKE_CUDA_FATBINARY","");
  psVar7 = cmMakefile::GetRequiredDefinition(local_2f0,(string *)local_310);
  local_3e8._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
  local_3e8._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
  local_3e8.field_2._M_allocated_capacity = 0;
  local_3e8.field_2._8_8_ = 0x51;
  local_3c8 = " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES";
  local_3c0 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_3e8;
  cmCatViews(&local_330,views_00);
  __l_01._M_len = 1;
  __l_01._M_array = &local_330;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,__l_01,&local_3e9);
  local_3e8._M_string_length = 0;
  local_3e8.field_2._M_allocated_capacity =
       local_3e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_3e8._M_dataplus._M_p = (pointer)paVar1;
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_370,pcVar5,&local_2c8,config,config,&local_3e8,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_290,(string *)&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar3) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                             local_330.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
    operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&local_250,0,local_248,0x965810);
  std::__cxx11::string::_M_replace((ulong)&local_270,0,local_268,0x96582b);
  pcVar8 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar8,(cmNinjaRule *)local_2b0);
  if (local_3b8 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_3b8->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  if ((pointer)local_3b0._0_8_ != (pointer)(local_3b0 + 0x10)) {
    operator_delete((void *)local_3b0._0_8_,CONCAT71(local_3b0._17_7_,local_3b0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_allocated_capacity != &local_380) {
    operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_2b0);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";
  std::string linker =
    this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
  vars.Linker = linker.c_str();

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}